

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsLSolve(N_Vector b,void *arkode_mem)

{
  int iVar1;
  undefined8 in_RDI;
  int nonlin_iter;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  long local_20;
  int local_4;
  
  local_4 = arkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0x1261a9);
  if (local_4 == 0) {
    iVar1 = SUNNonlinSolGetCurIter
                      (*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x88),
                       &stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      iVar1 = (**(code **)((long)in_stack_ffffffffffffffd8 + 0x130))
                        (*(undefined8 *)(local_20 + 0x2f0),
                         *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xe8),local_20,in_RDI,
                         *(undefined8 *)(local_20 + 0x248),
                         *(undefined8 *)
                          (*(long *)((long)in_stack_ffffffffffffffd8 + 0x38) +
                          (long)*(int *)((long)in_stack_ffffffffffffffd8 + 0x68) * 8),
                         in_stack_ffffffffffffffd0);
      if (iVar1 < 0) {
        local_4 = -7;
      }
      else if (iVar1 < 1) {
        local_4 = 0;
      }
      else {
        local_4 = 4;
      }
    }
    else {
      local_4 = -0x20;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsLSolve(N_Vector b, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nonlin_iter;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* retrieve nonlinear solver iteration from module */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nonlin_iter);
  if (retval != SUN_SUCCESS) { return (ARK_NLS_OP_ERR); }

  /* call linear solver interface, and handle return value */
  retval = step_mem->lsolve(ark_mem, b, ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage], step_mem->eRNrm,
                            nonlin_iter);

  if (retval < 0) { return (ARK_LSOLVE_FAIL); }
  if (retval > 0) { return (CONV_FAIL); }

  return (ARK_SUCCESS);
}